

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

int WebPInitDecoderConfigInternal(WebPDecoderConfig *config,int version)

{
  int iVar1;
  int in_ESI;
  void *in_RDI;
  undefined4 local_4;
  
  if (in_ESI >> 8 == 2) {
    if (in_RDI == (void *)0x0) {
      local_4 = 0;
    }
    else {
      memset(in_RDI,0,0xf0);
      DefaultFeatures((WebPBitstreamFeatures *)0x118b40);
      iVar1 = WebPInitDecBuffer((WebPDecBuffer *)0x118b4e);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int WebPInitDecoderConfigInternal(WebPDecoderConfig* config,
                                  int version) {
  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_DECODER_ABI_VERSION)) {
    return 0;   // version mismatch
  }
  if (config == NULL) {
    return 0;
  }
  memset(config, 0, sizeof(*config));
  DefaultFeatures(&config->input);
  if (!WebPInitDecBuffer(&config->output)) {
    return 0;
  }
  return 1;
}